

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2Synth::storeChanValues(V2Synth *this,int chan)

{
  byte bVar1;
  int iVar2;
  V2PatchMap *pVVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  syVChan *para;
  uint uVar8;
  float fVar9;
  float fVar10;
  
  if (0xf < (uint)chan) {
    __assert_fail("chan >= 0 && chan < CHANS",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgilje[P]v2m-player/src/synth_core.cpp"
                  ,0xc26,"void V2Synth::storeChanValues(int)");
  }
  lVar4 = (long)(char)this->chans[(uint)chan].pgm;
  if (-1 < lVar4) {
    pVVar3 = this->patchmap;
    uVar5 = (ulong)pVVar3->offsets[lVar4];
    para = this->chansv + (uint)chan;
    iVar2 = this->voicemap[(uint)chan];
    lVar4 = 0;
    do {
      (&para->chanvol)[lVar4] = (float)pVVar3->raw_data[lVar4 + uVar5 + 0x3b];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x1d);
    if (pVVar3->raw_data[uVar5 + 0x59] != '\0') {
      pbVar7 = pVVar3->raw_data + uVar5 + 0x5c;
      uVar6 = 0;
      do {
        if (0xe2 < (byte)(*pbVar7 + 0xa8)) {
          uVar8 = *pbVar7 - 0x3b;
          bVar1 = pbVar7[-1];
          fVar10 = (&para->chanvol)[uVar8];
          fVar9 = getmodsource(this,this->voicesw + iVar2,chan,(uint)pbVar7[-2]);
          fVar10 = fVar9 * ((float)bVar1 + -64.0) * 0.015625 + fVar10;
          fVar9 = 128.0;
          if (fVar10 <= 128.0) {
            fVar9 = fVar10;
          }
          (&para->chanvol)[uVar8] = (float)(~-(uint)(fVar10 < 0.0) & (uint)fVar9);
        }
        uVar6 = uVar6 + 1;
        pbVar7 = pbVar7 + 3;
      } while (uVar6 < pVVar3->raw_data[uVar5 + 0x59]);
    }
    V2Chan::set(this->chansw + (uint)chan,para);
    return;
  }
  __assert_fail("pgm >= 0 && pgm < 128",
                "/workspace/llm4binary/github/license_c_cmakelists/jgilje[P]v2m-player/src/synth_core.cpp"
                ,0xbdc,"const V2Sound *V2Synth::getpatch(int) const");
}

Assistant:

void storeChanValues(int chan)
    {
        assert(chan >= 0 && chan < CHANS);

        // get patch definition
        const V2Sound *patch = getpatch(chans[chan].pgm);

        // chan data
        syVChan *cpara = &chansv[chan];
        float *cparaf = (float *)cpara;
        V2Chan *cwork = &chansw[chan];
        V2Voice *voice = &voicesw[voicemap[chan]];

        // copy channel dependent data
        for (int i = 0; i < COUNTOF(patch->chan); i++)
            cparaf[i] = (float)patch->chan[i];

        // modulation matrix
        for (int i = 0; i < patch->modnum; i++)
        {
            const V2Mod *mod = &patch->modmatrix[i];
            int dest = mod->dest - COUNTOF(patch->voice);
            if (dest < 0 || dest >= COUNTOF(patch->chan))
                continue;

            float scale = (mod->val - 64.0f) / 64.0f;
            cparaf[dest] = clamp(cparaf[dest] + scale*getmodsource(voice, chan, mod->source), 0.0f, 128.0f);
        }

        cwork->set(cpara);
    }